

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

BinaryExpr<const_std::bitset<128UL>_&,_const_std::bitset<128UL>_&> * __thiscall
Catch::ExprLhs<std::bitset<128ul>const&>::operator==
          (BinaryExpr<const_std::bitset<128UL>_&,_const_std::bitset<128UL>_&>
           *__return_storage_ptr__,ExprLhs<std::bitset<128ul>const&> *this,bitset<128UL> *rhs)

{
  bitset<128UL> *pbVar1;
  bool bVar2;
  bool bVar3;
  StringRef local_38;
  
  pbVar1 = *(bitset<128UL> **)this;
  if ((pbVar1->super__Base_bitset<2UL>)._M_w[0] == (rhs->super__Base_bitset<2UL>)._M_w[0]) {
    bVar2 = false;
    do {
      bVar3 = bVar2;
      if (bVar3) break;
      bVar2 = true;
    } while ((pbVar1->super__Base_bitset<2UL>)._M_w[1] == (rhs->super__Base_bitset<2UL>)._M_w[1]);
  }
  else {
    bVar3 = false;
  }
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar3;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_00b5bb70;
  __return_storage_ptr__->m_lhs = pbVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }